

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_fold.c
# Opt level: O0

TRef lj_opt_cselim(jit_State *J,IRRef lim)

{
  ushort uVar1;
  TRef TVar2;
  uint in_ESI;
  jit_State *in_RDI;
  IRRef2 op12;
  IRRef ref;
  uint local_18;
  
  uVar1 = in_RDI->chain[(in_RDI->fold).ins.field_1.o];
  while( true ) {
    local_18 = (uint)uVar1;
    if (local_18 <= in_ESI) {
      TVar2 = lj_ir_emit(in_RDI);
      return TVar2;
    }
    if ((in_RDI->cur).ir[local_18].field_1.op12 ==
        (uint)(in_RDI->fold).ins.field_0.op1 + (uint)(in_RDI->fold).ins.field_0.op2 * 0x10000)
    break;
    uVar1 = *(ushort *)((long)(in_RDI->cur).ir + (ulong)local_18 * 8 + 6);
  }
  return local_18;
}

Assistant:

TRef LJ_FASTCALL lj_opt_cselim(jit_State *J, IRRef lim)
{
  IRRef ref = J->chain[fins->o];
  IRRef2 op12 = (IRRef2)fins->op1 + ((IRRef2)fins->op2 << 16);
  while (ref > lim) {
    if (IR(ref)->op12 == op12)
      return ref;
    ref = IR(ref)->prev;
  }
  return lj_ir_emit(J);
}